

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ValidationContextImpl::addIdRef(ValidationContextImpl *this,XMLCh *content)

{
  XMLRefInfo *this_00;
  
  if ((this->fIdRefList != (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0
      ) && (this->fToCheckIdRefList == true)) {
    this_00 = RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::get
                        (this->fIdRefList,content);
    if (this_00 == (XMLRefInfo *)0x0) {
      this_00 = (XMLRefInfo *)
                XMemory::operator_new(0x20,(this->super_ValidationContext).fMemoryManager);
      XMLRefInfo::XMLRefInfo
                (this_00,content,false,false,(this->super_ValidationContext).fMemoryManager);
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                (this->fIdRefList,this_00->fRefName,this_00);
    }
    this_00->fUsed = true;
  }
  return;
}

Assistant:

void ValidationContextImpl::addIdRef(const XMLCh * const content)
{
    if (!fIdRefList || !fToCheckIdRefList)
        return;

    XMLRefInfo* idEntry = fIdRefList->get(content);

    if (!idEntry)
    {
        idEntry = new (fMemoryManager) XMLRefInfo(content, false, false, fMemoryManager);
        fIdRefList->put((void*)idEntry->getRefName(), idEntry);
    }

    //
    //  Mark it used
    //
    idEntry->setUsed(true);

}